

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack16to8.h
# Opt level: O3

void ncnn::im2col_sgemm_pack16to8_avx512
               (Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  undefined4 uVar1;
  undefined1 auVar2 [32];
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  int *piVar18;
  int nn;
  uint uVar19;
  undefined1 (*pauVar20) [64];
  long lVar21;
  long lVar22;
  ulong uVar23;
  undefined1 (*pauVar24) [32];
  int nn_1;
  int iVar25;
  long lVar26;
  ulong uVar27;
  void **ppvVar28;
  char cVar29;
  uint uVar30;
  int iVar31;
  uint uVar32;
  undefined1 (*pauVar33) [64];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  ulong uVar34;
  long lVar35;
  undefined1 (*pauVar36) [32];
  uint uVar37;
  undefined1 (*pauVar38) [64];
  int iVar39;
  uint uVar40;
  int iVar41;
  int iVar42;
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  float zeros [16];
  Mat local_e8;
  ulong local_a0;
  ulong local_98;
  Mat *local_90;
  Mat *local_88;
  ulong local_80;
  undefined1 local_78 [64];
  
  uVar3 = bottom_im2col->w;
  lVar26 = (long)(int)uVar3;
  local_98 = (ulong)uVar3;
  iVar25 = bottom_im2col->h;
  uVar32 = bottom_im2col->c;
  uVar23 = (ulong)uVar32;
  local_a0 = (ulong)top_blob->c;
  local_e8.cstep = 0;
  local_e8.data = (void *)0x0;
  local_e8.refcount._0_4_ = 0;
  local_e8.refcount._4_4_ = 0;
  local_e8.elemsize._0_4_ = 0;
  local_e8.elemsize._4_4_ = 0;
  local_e8.elempack = 0;
  local_e8.allocator = (Allocator *)0x0;
  local_e8.dims = 0;
  local_e8.w = 0;
  local_e8.h = 0;
  local_e8.d = 0;
  local_e8.c = 0;
  local_90 = top_blob;
  local_88 = _bias;
  if (lVar26 < 8) {
    uVar19 = (uVar3 & 3) + 1;
    iVar39 = iVar25 * 4;
    if ((int)uVar3 < 4) {
      uVar19 = uVar3;
      iVar39 = iVar25;
    }
    Mat::create(&local_e8,iVar39,uVar32,uVar19,0x40,0x10,(Allocator *)opt);
    uVar19 = uVar3 + 7;
    if (-1 < (int)uVar3) {
      uVar19 = uVar3;
    }
    uVar19 = (int)uVar19 >> 3;
  }
  else {
    Mat::create(&local_e8,iVar25 * 8,uVar32,
                (uVar3 & 3) + (uVar3 >> 3) + (uint)((uVar3 >> 2 & 1) != 0),0x40,0x10,
                (Allocator *)opt);
    uVar19 = uVar3 >> 3;
    lVar21 = 0x100;
    uVar27 = 0;
    do {
      if (0 < (int)uVar32) {
        pauVar33 = (undefined1 (*) [64])
                   (local_e8.cstep * uVar27 *
                    CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize) +
                   (long)local_e8.data);
        uVar34 = 0;
        do {
          if (0 < iVar25) {
            pauVar38 = (undefined1 (*) [64])
                       ((long)bottom_im2col->data +
                       bottom_im2col->cstep * bottom_im2col->elemsize * uVar34 + lVar21);
            iVar39 = iVar25;
            do {
              auVar51 = vunpcklps_avx512f(pauVar38[-4],pauVar38[-3]);
              auVar52 = vunpckhps_avx512f(pauVar38[-4],pauVar38[-3]);
              auVar53 = vunpcklps_avx512f(pauVar38[-2],pauVar38[-1]);
              auVar54 = vunpckhps_avx512f(pauVar38[-2],pauVar38[-1]);
              auVar55 = vunpcklps_avx512f(*pauVar38,pauVar38[1]);
              auVar56 = vunpckhps_avx512f(*pauVar38,pauVar38[1]);
              auVar57 = vunpcklps_avx512f(pauVar38[2],pauVar38[3]);
              auVar58 = vunpckhps_avx512f(pauVar38[2],pauVar38[3]);
              auVar59 = vunpcklpd_avx512f(auVar51,auVar53);
              auVar51 = vunpckhpd_avx512f(auVar51,auVar53);
              auVar53 = vunpcklpd_avx512f(auVar52,auVar54);
              auVar52 = vunpckhpd_avx512f(auVar52,auVar54);
              auVar54 = vunpcklpd_avx512f(auVar55,auVar57);
              auVar55 = vunpckhpd_avx512f(auVar55,auVar57);
              auVar57 = vunpcklpd_avx512f(auVar56,auVar58);
              auVar56 = vunpckhpd_avx512f(auVar56,auVar58);
              auVar58 = vshuff64x2_avx512f(auVar59,auVar54,0x88);
              auVar60 = vshuff64x2_avx512f(auVar51,auVar55,0x88);
              auVar61 = vshuff64x2_avx512f(auVar53,auVar57,0x88);
              auVar62 = vshuff64x2_avx512f(auVar52,auVar56,0x88);
              auVar54 = vshuff64x2_avx512f(auVar59,auVar54,0xdd);
              auVar51 = vshuff64x2_avx512f(auVar51,auVar55,0xdd);
              auVar53 = vshuff64x2_avx512f(auVar53,auVar57,0xdd);
              auVar52 = vshuff64x2_avx512f(auVar52,auVar56,0xdd);
              auVar55 = vshuff64x2_avx512f(auVar58,auVar60,0x88);
              auVar56 = vshuff64x2_avx512f(auVar61,auVar62,0x88);
              auVar57 = vshuff64x2_avx512f(auVar54,auVar51,0x88);
              auVar59 = vshuff64x2_avx512f(auVar53,auVar52,0x88);
              auVar58 = vshuff64x2_avx512f(auVar58,auVar60,0xdd);
              auVar60 = vshuff64x2_avx512f(auVar61,auVar62,0xdd);
              auVar51 = vshuff64x2_avx512f(auVar54,auVar51,0xdd);
              auVar52 = vshuff64x2_avx512f(auVar53,auVar52,0xdd);
              *pauVar33 = auVar55;
              pauVar33[1] = auVar56;
              pauVar33[2] = auVar57;
              pauVar33[3] = auVar59;
              pauVar33[4] = auVar58;
              pauVar33[5] = auVar60;
              pauVar33[6] = auVar51;
              pauVar33[7] = auVar52;
              pauVar33 = pauVar33 + 8;
              pauVar38 = (undefined1 (*) [64])(*pauVar38 + (ulong)(uVar3 << 4) * 4);
              iVar39 = iVar39 + -1;
            } while (iVar39 != 0);
          }
          uVar34 = uVar34 + 1;
        } while (uVar34 != uVar23);
      }
      uVar27 = uVar27 + 1;
      lVar21 = lVar21 + 0x200;
    } while (uVar27 != uVar19);
  }
  iVar39 = uVar19 * 8;
  uVar19 = uVar3 + uVar19 * -8;
  uVar30 = (int)uVar19 >> 2;
  if (0 < (int)uVar30) {
    lVar21 = (long)iVar39 * 0x40 + 0xc0;
    uVar27 = 0;
    do {
      if (0 < (int)uVar32) {
        uVar37 = iVar39 + (int)uVar27 * 4;
        uVar40 = iVar39 + (int)uVar27 * 4 + 7;
        if (-1 < (int)uVar37) {
          uVar40 = uVar37;
        }
        pauVar33 = (undefined1 (*) [64])
                   ((long)(((int)uVar40 >> 3) + ((int)(uVar37 - (uVar40 & 0xfffffff8)) >> 2)) *
                    local_e8.cstep * CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize)
                   + (long)local_e8.data);
        uVar34 = 0;
        do {
          if (0 < iVar25) {
            pauVar38 = (undefined1 (*) [64])
                       ((long)bottom_im2col->data +
                       bottom_im2col->cstep * bottom_im2col->elemsize * uVar34 + lVar21);
            iVar42 = iVar25;
            do {
              auVar51 = vunpcklps_avx512f(pauVar38[-3],pauVar38[-2]);
              auVar52 = vunpckhps_avx512f(pauVar38[-3],pauVar38[-2]);
              auVar53 = vunpcklps_avx512f(pauVar38[-1],*pauVar38);
              auVar54 = vunpckhps_avx512f(pauVar38[-1],*pauVar38);
              auVar55 = vunpcklpd_avx512f(auVar51,auVar53);
              auVar51 = vunpckhpd_avx512f(auVar51,auVar53);
              auVar53 = vunpcklpd_avx512f(auVar52,auVar54);
              auVar52 = vunpckhpd_avx512f(auVar52,auVar54);
              auVar54 = vshuff64x2_avx512f(auVar55,auVar51,0x88);
              auVar56 = vshuff64x2_avx512f(auVar53,auVar52,0x88);
              auVar51 = vshuff64x2_avx512f(auVar55,auVar51,0xdd);
              auVar52 = vshuff64x2_avx512f(auVar53,auVar52,0xdd);
              auVar53 = vshuff64x2_avx512f(auVar54,auVar56,0x88);
              auVar55 = vshuff64x2_avx512f(auVar51,auVar52,0x88);
              auVar54 = vshuff64x2_avx512f(auVar54,auVar56,0xdd);
              auVar51 = vshuff64x2_avx512f(auVar51,auVar52,0xdd);
              *pauVar33 = auVar53;
              pauVar33[1] = auVar55;
              pauVar33[2] = auVar54;
              pauVar33[3] = auVar51;
              pauVar33 = pauVar33 + 4;
              pauVar38 = (undefined1 (*) [64])(*pauVar38 + (long)(int)(uVar3 << 4) * 4);
              iVar42 = iVar42 + -1;
            } while (iVar42 != 0);
          }
          uVar34 = uVar34 + 1;
        } while (uVar34 != uVar23);
      }
      uVar27 = uVar27 + 1;
      lVar21 = lVar21 + 0x100;
    } while (uVar27 != uVar30);
  }
  iVar39 = (uVar19 & 0xfffffffc) + iVar39;
  if (iVar39 < (int)local_98) {
    lVar21 = (long)iVar39;
    lVar22 = lVar21 << 6;
    do {
      if (0 < (int)uVar32) {
        uVar19 = (uint)lVar21;
        uVar30 = uVar19 + 3;
        if (-1 < (int)uVar19) {
          uVar30 = uVar19;
        }
        uVar40 = uVar19 + 7;
        if (-1 < (int)uVar19) {
          uVar40 = uVar19;
        }
        cVar29 = (char)lVar21 - ((byte)uVar40 & 0xf8);
        pauVar33 = (undefined1 (*) [64])
                   ((long)(int)((int)((char)(((byte)(cVar29 >> 7) >> 6) + cVar29) >> 2) +
                               ((int)uVar40 >> 3) + (uVar19 - (uVar30 & 0xfffffffc))) *
                    local_e8.cstep * CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize)
                   + (long)local_e8.data);
        uVar27 = 0;
        do {
          if (0 < iVar25) {
            pauVar38 = (undefined1 (*) [64])
                       ((long)bottom_im2col->data +
                       bottom_im2col->cstep * bottom_im2col->elemsize * uVar27 + lVar22);
            iVar39 = iVar25;
            do {
              *pauVar33 = *pauVar38;
              pauVar33 = pauVar33 + 1;
              pauVar38 = (undefined1 (*) [64])(*pauVar38 + (long)(int)(uVar3 << 4) * 4);
              iVar39 = iVar39 + -1;
            } while (iVar39 != 0);
          }
          uVar27 = uVar27 + 1;
        } while (uVar27 != uVar23);
      }
      lVar21 = lVar21 + 1;
      lVar22 = lVar22 + 0x40;
    } while (lVar21 < lVar26);
  }
  uVar19 = (int)local_a0 >> 1;
  if (0 < (int)uVar19) {
    iVar39 = uVar32 * iVar25;
    iVar42 = iVar39 * 0x10;
    local_80 = (ulong)uVar19;
    uVar23 = 0;
    do {
      pauVar33 = (undefined1 (*) [64])
                 (uVar23 * 2 * local_90->cstep * local_90->elemsize + (long)local_90->data);
      pauVar38 = (undefined1 (*) [64])
                 ((uVar23 * 2 + 1) * local_90->cstep * local_90->elemsize + (long)local_90->data);
      ppvVar28 = &local_88->data + uVar23 * 8;
      if (local_88 == (Mat *)0x0) {
        ppvVar28 = (void **)local_78;
      }
      local_78 = ZEXT864(0) << 0x40;
      if ((int)local_98 < 8) {
        uVar27 = 0;
      }
      else {
        lVar21 = 0;
        uVar34 = 0;
        do {
          auVar51 = *(undefined1 (*) [64])ppvVar28;
          auVar52 = auVar51;
          auVar53 = auVar51;
          auVar54 = auVar51;
          auVar55 = auVar51;
          auVar56 = auVar51;
          auVar57 = auVar51;
          auVar58 = auVar51;
          if (0 < iVar39 * 0x10) {
            lVar22 = local_e8.cstep *
                     CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize) * lVar21;
            lVar35 = 0;
            iVar31 = iVar42;
            do {
              auVar59 = *(undefined1 (*) [64])
                         ((long)kernel->data +
                         lVar35 * 2 + kernel->cstep * uVar23 * kernel->elemsize);
              uVar1 = *(undefined4 *)((long)local_e8.data + lVar35 + lVar22);
              auVar60._4_4_ = uVar1;
              auVar60._0_4_ = uVar1;
              auVar60._8_4_ = uVar1;
              auVar60._12_4_ = uVar1;
              auVar60._16_4_ = uVar1;
              auVar60._20_4_ = uVar1;
              auVar60._24_4_ = uVar1;
              auVar60._28_4_ = uVar1;
              auVar60._32_4_ = uVar1;
              auVar60._36_4_ = uVar1;
              auVar60._40_4_ = uVar1;
              auVar60._44_4_ = uVar1;
              auVar60._48_4_ = uVar1;
              auVar60._52_4_ = uVar1;
              auVar60._56_4_ = uVar1;
              auVar60._60_4_ = uVar1;
              auVar51 = vfmadd231ps_avx512f(auVar51,auVar59,auVar60);
              uVar1 = *(undefined4 *)((long)local_e8.data + lVar35 + lVar22 + 4);
              auVar61._4_4_ = uVar1;
              auVar61._0_4_ = uVar1;
              auVar61._8_4_ = uVar1;
              auVar61._12_4_ = uVar1;
              auVar61._16_4_ = uVar1;
              auVar61._20_4_ = uVar1;
              auVar61._24_4_ = uVar1;
              auVar61._28_4_ = uVar1;
              auVar61._32_4_ = uVar1;
              auVar61._36_4_ = uVar1;
              auVar61._40_4_ = uVar1;
              auVar61._44_4_ = uVar1;
              auVar61._48_4_ = uVar1;
              auVar61._52_4_ = uVar1;
              auVar61._56_4_ = uVar1;
              auVar61._60_4_ = uVar1;
              auVar58 = vfmadd231ps_avx512f(auVar58,auVar59,auVar61);
              uVar1 = *(undefined4 *)((long)local_e8.data + lVar35 + lVar22 + 8);
              auVar62._4_4_ = uVar1;
              auVar62._0_4_ = uVar1;
              auVar62._8_4_ = uVar1;
              auVar62._12_4_ = uVar1;
              auVar62._16_4_ = uVar1;
              auVar62._20_4_ = uVar1;
              auVar62._24_4_ = uVar1;
              auVar62._28_4_ = uVar1;
              auVar62._32_4_ = uVar1;
              auVar62._36_4_ = uVar1;
              auVar62._40_4_ = uVar1;
              auVar62._44_4_ = uVar1;
              auVar62._48_4_ = uVar1;
              auVar62._52_4_ = uVar1;
              auVar62._56_4_ = uVar1;
              auVar62._60_4_ = uVar1;
              auVar57 = vfmadd231ps_avx512f(auVar57,auVar59,auVar62);
              uVar1 = *(undefined4 *)((long)local_e8.data + lVar35 + lVar22 + 0xc);
              auVar13._4_4_ = uVar1;
              auVar13._0_4_ = uVar1;
              auVar13._8_4_ = uVar1;
              auVar13._12_4_ = uVar1;
              auVar13._16_4_ = uVar1;
              auVar13._20_4_ = uVar1;
              auVar13._24_4_ = uVar1;
              auVar13._28_4_ = uVar1;
              auVar13._32_4_ = uVar1;
              auVar13._36_4_ = uVar1;
              auVar13._40_4_ = uVar1;
              auVar13._44_4_ = uVar1;
              auVar13._48_4_ = uVar1;
              auVar13._52_4_ = uVar1;
              auVar13._56_4_ = uVar1;
              auVar13._60_4_ = uVar1;
              auVar56 = vfmadd231ps_avx512f(auVar56,auVar59,auVar13);
              uVar1 = *(undefined4 *)((long)local_e8.data + lVar35 + lVar22 + 0x10);
              auVar14._4_4_ = uVar1;
              auVar14._0_4_ = uVar1;
              auVar14._8_4_ = uVar1;
              auVar14._12_4_ = uVar1;
              auVar14._16_4_ = uVar1;
              auVar14._20_4_ = uVar1;
              auVar14._24_4_ = uVar1;
              auVar14._28_4_ = uVar1;
              auVar14._32_4_ = uVar1;
              auVar14._36_4_ = uVar1;
              auVar14._40_4_ = uVar1;
              auVar14._44_4_ = uVar1;
              auVar14._48_4_ = uVar1;
              auVar14._52_4_ = uVar1;
              auVar14._56_4_ = uVar1;
              auVar14._60_4_ = uVar1;
              auVar55 = vfmadd231ps_avx512f(auVar55,auVar59,auVar14);
              uVar1 = *(undefined4 *)((long)local_e8.data + lVar35 + lVar22 + 0x14);
              auVar15._4_4_ = uVar1;
              auVar15._0_4_ = uVar1;
              auVar15._8_4_ = uVar1;
              auVar15._12_4_ = uVar1;
              auVar15._16_4_ = uVar1;
              auVar15._20_4_ = uVar1;
              auVar15._24_4_ = uVar1;
              auVar15._28_4_ = uVar1;
              auVar15._32_4_ = uVar1;
              auVar15._36_4_ = uVar1;
              auVar15._40_4_ = uVar1;
              auVar15._44_4_ = uVar1;
              auVar15._48_4_ = uVar1;
              auVar15._52_4_ = uVar1;
              auVar15._56_4_ = uVar1;
              auVar15._60_4_ = uVar1;
              auVar54 = vfmadd231ps_avx512f(auVar54,auVar59,auVar15);
              uVar1 = *(undefined4 *)((long)local_e8.data + lVar35 + lVar22 + 0x18);
              auVar16._4_4_ = uVar1;
              auVar16._0_4_ = uVar1;
              auVar16._8_4_ = uVar1;
              auVar16._12_4_ = uVar1;
              auVar16._16_4_ = uVar1;
              auVar16._20_4_ = uVar1;
              auVar16._24_4_ = uVar1;
              auVar16._28_4_ = uVar1;
              auVar16._32_4_ = uVar1;
              auVar16._36_4_ = uVar1;
              auVar16._40_4_ = uVar1;
              auVar16._44_4_ = uVar1;
              auVar16._48_4_ = uVar1;
              auVar16._52_4_ = uVar1;
              auVar16._56_4_ = uVar1;
              auVar16._60_4_ = uVar1;
              auVar53 = vfmadd231ps_avx512f(auVar53,auVar59,auVar16);
              uVar1 = *(undefined4 *)((long)local_e8.data + lVar35 + lVar22 + 0x1c);
              auVar17._4_4_ = uVar1;
              auVar17._0_4_ = uVar1;
              auVar17._8_4_ = uVar1;
              auVar17._12_4_ = uVar1;
              auVar17._16_4_ = uVar1;
              auVar17._20_4_ = uVar1;
              auVar17._24_4_ = uVar1;
              auVar17._28_4_ = uVar1;
              auVar17._32_4_ = uVar1;
              auVar17._36_4_ = uVar1;
              auVar17._40_4_ = uVar1;
              auVar17._44_4_ = uVar1;
              auVar17._48_4_ = uVar1;
              auVar17._52_4_ = uVar1;
              auVar17._56_4_ = uVar1;
              auVar17._60_4_ = uVar1;
              auVar52 = vfmadd231ps_avx512f(auVar52,auVar59,auVar17);
              lVar35 = lVar35 + 0x20;
              iVar31 = iVar31 + -1;
            } while (iVar31 != 0);
          }
          auVar59 = vinsertf64x4_avx512f(auVar51,auVar58._0_32_,1);
          *pauVar33 = auVar59;
          auVar59 = vinsertf64x4_avx512f(auVar57,auVar56._0_32_,1);
          pauVar33[1] = auVar59;
          auVar59 = vinsertf64x4_avx512f(auVar55,auVar54._0_32_,1);
          pauVar33[2] = auVar59;
          auVar59 = vinsertf64x4_avx512f(auVar53,auVar52._0_32_,1);
          pauVar33[3] = auVar59;
          auVar51 = vshuff64x2_avx512f(auVar51,auVar58,0xee);
          *pauVar38 = auVar51;
          auVar51 = vshuff64x2_avx512f(auVar57,auVar56,0xee);
          pauVar38[1] = auVar51;
          auVar51 = vshuff64x2_avx512f(auVar55,auVar54,0xee);
          pauVar38[2] = auVar51;
          auVar51 = vshuff64x2_avx512f(auVar53,auVar52,0xee);
          pauVar38[3] = auVar51;
          pauVar33 = pauVar33 + 4;
          pauVar38 = pauVar38 + 4;
          uVar27 = uVar34 + 8;
          lVar22 = uVar34 + 0xf;
          lVar21 = lVar21 + 1;
          uVar34 = uVar27;
        } while (lVar22 < lVar26);
      }
      if ((int)((uint)uVar27 | 3) < (int)uVar3) {
        uVar19 = 0;
        do {
          auVar51 = *(undefined1 (*) [64])ppvVar28;
          iVar31 = (int)uVar27;
          auVar52 = auVar51;
          auVar53 = auVar51;
          auVar54 = auVar51;
          if (0 < iVar39 * 0x10) {
            lVar21 = local_e8.cstep *
                     CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize) *
                     (ulong)((uVar19 & 1) + ((uint)(uVar27 >> 3) & 0x1fffffff));
            lVar22 = 0;
            iVar41 = iVar42;
            do {
              auVar55 = *(undefined1 (*) [64])
                         ((long)kernel->data +
                         lVar22 * 4 + kernel->cstep * uVar23 * kernel->elemsize);
              uVar1 = *(undefined4 *)((long)local_e8.data + lVar22 + lVar21);
              auVar56._4_4_ = uVar1;
              auVar56._0_4_ = uVar1;
              auVar56._8_4_ = uVar1;
              auVar56._12_4_ = uVar1;
              auVar56._16_4_ = uVar1;
              auVar56._20_4_ = uVar1;
              auVar56._24_4_ = uVar1;
              auVar56._28_4_ = uVar1;
              auVar56._32_4_ = uVar1;
              auVar56._36_4_ = uVar1;
              auVar56._40_4_ = uVar1;
              auVar56._44_4_ = uVar1;
              auVar56._48_4_ = uVar1;
              auVar56._52_4_ = uVar1;
              auVar56._56_4_ = uVar1;
              auVar56._60_4_ = uVar1;
              auVar53 = vfmadd231ps_avx512f(auVar53,auVar55,auVar56);
              uVar1 = *(undefined4 *)((long)local_e8.data + lVar22 + lVar21 + 4);
              auVar57._4_4_ = uVar1;
              auVar57._0_4_ = uVar1;
              auVar57._8_4_ = uVar1;
              auVar57._12_4_ = uVar1;
              auVar57._16_4_ = uVar1;
              auVar57._20_4_ = uVar1;
              auVar57._24_4_ = uVar1;
              auVar57._28_4_ = uVar1;
              auVar57._32_4_ = uVar1;
              auVar57._36_4_ = uVar1;
              auVar57._40_4_ = uVar1;
              auVar57._44_4_ = uVar1;
              auVar57._48_4_ = uVar1;
              auVar57._52_4_ = uVar1;
              auVar57._56_4_ = uVar1;
              auVar57._60_4_ = uVar1;
              auVar54 = vfmadd231ps_avx512f(auVar54,auVar55,auVar57);
              uVar1 = *(undefined4 *)((long)local_e8.data + lVar22 + lVar21 + 8);
              auVar58._4_4_ = uVar1;
              auVar58._0_4_ = uVar1;
              auVar58._8_4_ = uVar1;
              auVar58._12_4_ = uVar1;
              auVar58._16_4_ = uVar1;
              auVar58._20_4_ = uVar1;
              auVar58._24_4_ = uVar1;
              auVar58._28_4_ = uVar1;
              auVar58._32_4_ = uVar1;
              auVar58._36_4_ = uVar1;
              auVar58._40_4_ = uVar1;
              auVar58._44_4_ = uVar1;
              auVar58._48_4_ = uVar1;
              auVar58._52_4_ = uVar1;
              auVar58._56_4_ = uVar1;
              auVar58._60_4_ = uVar1;
              auVar52 = vfmadd231ps_avx512f(auVar52,auVar55,auVar58);
              uVar1 = *(undefined4 *)((long)local_e8.data + lVar22 + lVar21 + 0xc);
              auVar59._4_4_ = uVar1;
              auVar59._0_4_ = uVar1;
              auVar59._8_4_ = uVar1;
              auVar59._12_4_ = uVar1;
              auVar59._16_4_ = uVar1;
              auVar59._20_4_ = uVar1;
              auVar59._24_4_ = uVar1;
              auVar59._28_4_ = uVar1;
              auVar59._32_4_ = uVar1;
              auVar59._36_4_ = uVar1;
              auVar59._40_4_ = uVar1;
              auVar59._44_4_ = uVar1;
              auVar59._48_4_ = uVar1;
              auVar59._52_4_ = uVar1;
              auVar59._56_4_ = uVar1;
              auVar59._60_4_ = uVar1;
              auVar51 = vfmadd231ps_avx512f(auVar51,auVar55,auVar59);
              lVar22 = lVar22 + 0x10;
              iVar41 = iVar41 + -1;
            } while (iVar41 != 0);
          }
          auVar55 = vinsertf64x4_avx512f(auVar53,auVar54._0_32_,1);
          *pauVar33 = auVar55;
          auVar55 = vinsertf64x4_avx512f(auVar52,auVar51._0_32_,1);
          pauVar33[1] = auVar55;
          auVar53 = vshuff64x2_avx512f(auVar53,auVar54,0xee);
          *pauVar38 = auVar53;
          auVar51 = vshuff64x2_avx512f(auVar52,auVar51,0xee);
          pauVar38[1] = auVar51;
          pauVar33 = pauVar33 + 2;
          pauVar38 = pauVar38 + 2;
          uVar27 = (ulong)(iVar31 + 4);
          uVar19 = (uint)(byte)((char)uVar19 + 1);
        } while (iVar31 + 7 < (int)uVar3);
      }
      else {
        uVar27 = uVar27 & 0xffffffff;
      }
      if ((int)uVar27 < (int)uVar3) {
        do {
          uVar19 = (uint)uVar27;
          auVar51 = *(undefined1 (*) [64])ppvVar28;
          if (0 < iVar39 * 0x10) {
            pauVar20 = (undefined1 (*) [64])
                       (kernel->cstep * uVar23 * kernel->elemsize + (long)kernel->data);
            lVar21 = 0;
            do {
              auVar52 = vbroadcastss_avx512f
                                  (ZEXT416(*(uint *)((long)local_e8.data +
                                                    lVar21 * 4 +
                                                    local_e8.cstep *
                                                    CONCAT44(local_e8.elemsize._4_4_,
                                                             (undefined4)local_e8.elemsize) *
                                                    (ulong)((uVar19 & 3) + (int)(uVar27 >> 3) +
                                                           (uint)((uVar19 >> 2 & 1) != 0)))));
              auVar51 = vfmadd231ps_avx512f(auVar51,auVar52,*pauVar20);
              pauVar20 = pauVar20 + 1;
              lVar21 = lVar21 + 1;
            } while (iVar42 != (int)lVar21);
          }
          *(undefined1 (*) [32])*pauVar33 = auVar51._0_32_;
          auVar43 = vextractf64x4_avx512f(auVar51,1);
          *(undefined1 (*) [32])*pauVar38 = auVar43;
          pauVar33 = (undefined1 (*) [64])((long)*pauVar33 + 0x20);
          pauVar38 = (undefined1 (*) [64])((long)*pauVar38 + 0x20);
          uVar27 = (ulong)(uVar19 + 1);
        } while (uVar19 + 1 != uVar3);
      }
      uVar23 = uVar23 + 1;
    } while (uVar23 != local_80);
  }
  uVar23 = local_a0 & 0xfffffffffffffffe;
  if ((int)uVar23 != (int)local_a0) {
    iVar25 = iVar25 * uVar32;
    iVar39 = iVar25 * 0x10;
    do {
      auVar51 = local_78;
      pauVar24 = (undefined1 (*) [32])
                 (local_90->cstep * uVar23 * local_90->elemsize + (long)local_90->data);
      ppvVar28 = &local_88->data + uVar23 * 4;
      if (local_88 == (Mat *)0x0) {
        ppvVar28 = (void **)local_78;
      }
      local_78._32_32_ = auVar51._32_32_;
      local_78._0_32_ = ZEXT1632(ZEXT816(0));
      iVar42 = (int)uVar23;
      if ((int)uVar3 < 8) {
        uVar27 = 0;
      }
      else {
        uVar32 = ((uint)(uVar23 >> 0x1f) & 1) + iVar42;
        lVar21 = 0;
        uVar34 = 0;
        do {
          auVar43 = *(undefined1 (*) [32])ppvVar28;
          auVar44 = auVar43;
          auVar45 = auVar43;
          auVar46 = auVar43;
          auVar47 = auVar43;
          auVar48 = auVar43;
          auVar49 = auVar43;
          auVar50 = auVar43;
          if (0 < iVar25 * 0x10) {
            lVar22 = local_e8.cstep *
                     CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize) * lVar21;
            lVar35 = 0;
            iVar31 = iVar39;
            do {
              auVar2 = *(undefined1 (*) [32])
                        ((long)kernel->data +
                        lVar35 + kernel->cstep *
                                 (long)(int)(((int)uVar32 >> 1) + (iVar42 - (uVar32 & 0xfffffffe)))
                                 * kernel->elemsize);
              uVar1 = *(undefined4 *)((long)local_e8.data + lVar35 + lVar22);
              auVar5._4_4_ = uVar1;
              auVar5._0_4_ = uVar1;
              auVar5._8_4_ = uVar1;
              auVar5._12_4_ = uVar1;
              auVar5._16_4_ = uVar1;
              auVar5._20_4_ = uVar1;
              auVar5._24_4_ = uVar1;
              auVar5._28_4_ = uVar1;
              auVar43 = vfmadd231ps_avx512vl(auVar43,auVar2,auVar5);
              uVar1 = *(undefined4 *)((long)local_e8.data + lVar35 + lVar22 + 4);
              auVar6._4_4_ = uVar1;
              auVar6._0_4_ = uVar1;
              auVar6._8_4_ = uVar1;
              auVar6._12_4_ = uVar1;
              auVar6._16_4_ = uVar1;
              auVar6._20_4_ = uVar1;
              auVar6._24_4_ = uVar1;
              auVar6._28_4_ = uVar1;
              auVar44 = vfmadd231ps_avx512vl(auVar44,auVar2,auVar6);
              uVar1 = *(undefined4 *)((long)local_e8.data + lVar35 + lVar22 + 8);
              auVar7._4_4_ = uVar1;
              auVar7._0_4_ = uVar1;
              auVar7._8_4_ = uVar1;
              auVar7._12_4_ = uVar1;
              auVar7._16_4_ = uVar1;
              auVar7._20_4_ = uVar1;
              auVar7._24_4_ = uVar1;
              auVar7._28_4_ = uVar1;
              auVar45 = vfmadd231ps_avx512vl(auVar45,auVar2,auVar7);
              uVar1 = *(undefined4 *)((long)local_e8.data + lVar35 + lVar22 + 0xc);
              auVar8._4_4_ = uVar1;
              auVar8._0_4_ = uVar1;
              auVar8._8_4_ = uVar1;
              auVar8._12_4_ = uVar1;
              auVar8._16_4_ = uVar1;
              auVar8._20_4_ = uVar1;
              auVar8._24_4_ = uVar1;
              auVar8._28_4_ = uVar1;
              auVar46 = vfmadd231ps_avx512vl(auVar46,auVar2,auVar8);
              uVar1 = *(undefined4 *)((long)local_e8.data + lVar35 + lVar22 + 0x10);
              auVar9._4_4_ = uVar1;
              auVar9._0_4_ = uVar1;
              auVar9._8_4_ = uVar1;
              auVar9._12_4_ = uVar1;
              auVar9._16_4_ = uVar1;
              auVar9._20_4_ = uVar1;
              auVar9._24_4_ = uVar1;
              auVar9._28_4_ = uVar1;
              auVar47 = vfmadd231ps_avx512vl(auVar47,auVar2,auVar9);
              uVar1 = *(undefined4 *)((long)local_e8.data + lVar35 + lVar22 + 0x14);
              auVar10._4_4_ = uVar1;
              auVar10._0_4_ = uVar1;
              auVar10._8_4_ = uVar1;
              auVar10._12_4_ = uVar1;
              auVar10._16_4_ = uVar1;
              auVar10._20_4_ = uVar1;
              auVar10._24_4_ = uVar1;
              auVar10._28_4_ = uVar1;
              auVar48 = vfmadd231ps_avx512vl(auVar48,auVar2,auVar10);
              uVar1 = *(undefined4 *)((long)local_e8.data + lVar35 + lVar22 + 0x18);
              auVar11._4_4_ = uVar1;
              auVar11._0_4_ = uVar1;
              auVar11._8_4_ = uVar1;
              auVar11._12_4_ = uVar1;
              auVar11._16_4_ = uVar1;
              auVar11._20_4_ = uVar1;
              auVar11._24_4_ = uVar1;
              auVar11._28_4_ = uVar1;
              auVar49 = vfmadd231ps_avx512vl(auVar49,auVar2,auVar11);
              uVar1 = *(undefined4 *)((long)local_e8.data + lVar35 + lVar22 + 0x1c);
              auVar12._4_4_ = uVar1;
              auVar12._0_4_ = uVar1;
              auVar12._8_4_ = uVar1;
              auVar12._12_4_ = uVar1;
              auVar12._16_4_ = uVar1;
              auVar12._20_4_ = uVar1;
              auVar12._24_4_ = uVar1;
              auVar12._28_4_ = uVar1;
              auVar50 = vfmadd231ps_avx512vl(auVar50,auVar2,auVar12);
              lVar35 = lVar35 + 0x20;
              iVar31 = iVar31 + -1;
            } while (iVar31 != 0);
          }
          *pauVar24 = auVar43;
          pauVar24[1] = auVar44;
          pauVar24[2] = auVar45;
          pauVar24[3] = auVar46;
          pauVar24[4] = auVar47;
          pauVar24[5] = auVar48;
          pauVar24[6] = auVar49;
          pauVar24[7] = auVar50;
          pauVar24 = pauVar24 + 8;
          uVar27 = uVar34 + 8;
          lVar22 = uVar34 + 0xf;
          lVar21 = lVar21 + 1;
          uVar34 = uVar27;
        } while (lVar22 < lVar26);
      }
      if ((int)((uint)uVar27 | 3) < (int)uVar3) {
        uVar32 = ((uint)(uVar23 >> 0x1f) & 1) + iVar42;
        uVar19 = 0;
        do {
          auVar43 = *(undefined1 (*) [32])ppvVar28;
          iVar31 = (int)uVar27;
          auVar48 = auVar43;
          auVar46 = auVar43;
          auVar47 = auVar43;
          if (0 < iVar25 * 0x10) {
            lVar21 = local_e8.cstep *
                     CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize) *
                     (ulong)((uVar19 & 1) + ((uint)(uVar27 >> 3) & 0x1fffffff));
            lVar22 = 0;
            iVar41 = iVar39;
            do {
              auVar45 = *(undefined1 (*) [32])
                         ((long)kernel->data +
                         lVar22 * 2 +
                         kernel->cstep *
                         (long)(int)(((int)uVar32 >> 1) + (iVar42 - (uVar32 & 0xfffffffe))) *
                         kernel->elemsize);
              uVar1 = *(undefined4 *)((long)local_e8.data + lVar22 + lVar21);
              auVar44._4_4_ = uVar1;
              auVar44._0_4_ = uVar1;
              auVar44._8_4_ = uVar1;
              auVar44._12_4_ = uVar1;
              auVar44._16_4_ = uVar1;
              auVar44._20_4_ = uVar1;
              auVar44._24_4_ = uVar1;
              auVar44._28_4_ = uVar1;
              auVar43 = vfmadd231ps_avx512vl(auVar43,auVar45,auVar44);
              uVar1 = *(undefined4 *)((long)local_e8.data + lVar22 + lVar21 + 4);
              auVar50._4_4_ = uVar1;
              auVar50._0_4_ = uVar1;
              auVar50._8_4_ = uVar1;
              auVar50._12_4_ = uVar1;
              auVar50._16_4_ = uVar1;
              auVar50._20_4_ = uVar1;
              auVar50._24_4_ = uVar1;
              auVar50._28_4_ = uVar1;
              auVar48 = vfmadd231ps_avx512vl(auVar48,auVar45,auVar50);
              uVar1 = *(undefined4 *)((long)local_e8.data + lVar22 + lVar21 + 8);
              auVar49._4_4_ = uVar1;
              auVar49._0_4_ = uVar1;
              auVar49._8_4_ = uVar1;
              auVar49._12_4_ = uVar1;
              auVar49._16_4_ = uVar1;
              auVar49._20_4_ = uVar1;
              auVar49._24_4_ = uVar1;
              auVar49._28_4_ = uVar1;
              auVar46 = vfmadd231ps_avx512vl(auVar46,auVar45,auVar49);
              uVar1 = *(undefined4 *)((long)local_e8.data + lVar22 + lVar21 + 0xc);
              auVar2._4_4_ = uVar1;
              auVar2._0_4_ = uVar1;
              auVar2._8_4_ = uVar1;
              auVar2._12_4_ = uVar1;
              auVar2._16_4_ = uVar1;
              auVar2._20_4_ = uVar1;
              auVar2._24_4_ = uVar1;
              auVar2._28_4_ = uVar1;
              auVar47 = vfmadd231ps_avx512vl(auVar47,auVar45,auVar2);
              lVar22 = lVar22 + 0x10;
              iVar41 = iVar41 + -1;
            } while (iVar41 != 0);
          }
          *pauVar24 = auVar43;
          pauVar24[1] = auVar48;
          pauVar24[2] = auVar46;
          pauVar24[3] = auVar47;
          pauVar24 = pauVar24 + 4;
          uVar27 = (ulong)(iVar31 + 4);
          uVar19 = (uint)(byte)((char)uVar19 + 1);
        } while (iVar31 + 7 < (int)uVar3);
      }
      else {
        uVar27 = uVar27 & 0xffffffff;
      }
      if ((int)uVar27 < (int)local_98) {
        uVar32 = ((uint)(uVar23 >> 0x1f) & 1) + iVar42;
        do {
          uVar19 = (uint)uVar27;
          auVar43 = *(undefined1 (*) [32])ppvVar28;
          auVar51 = ZEXT3264(auVar43);
          if (0 < iVar25 * 0x10) {
            pauVar36 = (undefined1 (*) [32])
                       (kernel->cstep *
                        (long)(int)(((int)uVar32 >> 1) + (iVar42 - (uVar32 & 0xfffffffe))) *
                        kernel->elemsize + (long)kernel->data);
            lVar21 = 0;
            do {
              uVar1 = *(undefined4 *)
                       ((long)local_e8.data +
                       lVar21 * 4 +
                       local_e8.cstep *
                       CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize) *
                       (ulong)((uVar19 & 3) + (int)(uVar27 >> 3) + (uint)((uVar19 >> 2 & 1) != 0)));
              auVar43._4_4_ = uVar1;
              auVar43._0_4_ = uVar1;
              auVar43._8_4_ = uVar1;
              auVar43._12_4_ = uVar1;
              auVar43._16_4_ = uVar1;
              auVar43._20_4_ = uVar1;
              auVar43._24_4_ = uVar1;
              auVar43._28_4_ = uVar1;
              auVar4 = vfmadd231ps_fma(auVar51._0_32_,auVar43,*pauVar36);
              auVar51 = ZEXT1664(auVar4);
              auVar43 = ZEXT1632(auVar4);
              pauVar36 = pauVar36 + 1;
              lVar21 = lVar21 + 1;
            } while (iVar39 != (int)lVar21);
          }
          *pauVar24 = auVar43;
          pauVar24 = pauVar24 + 1;
          uVar27 = (ulong)(uVar19 + 1);
        } while (uVar19 + 1 != uVar3);
      }
      uVar23 = uVar23 + 1;
    } while ((long)uVar23 < (long)local_a0);
  }
  piVar18 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
  if (piVar18 != (int *)0x0) {
    LOCK();
    *piVar18 = *piVar18 + -1;
    UNLOCK();
    if (*piVar18 == 0) {
      if (local_e8.allocator == (Allocator *)0x0) {
        if (local_e8.data != (void *)0x0) {
          free(local_e8.data);
        }
      }
      else {
        (**(code **)(*(long *)local_e8.allocator + 0x18))();
      }
    }
  }
  return;
}

Assistant:

static void im2col_sgemm_pack16to8_avx512(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    // Mat bottom_im2col(size, maxk, inch, 64u, 16, opt.workspace_allocator);

    const int size = bottom_im2col.w;
    const int maxk = bottom_im2col.h;
    const int inch = bottom_im2col.c;

    const int outch = top_blob.c;

    const float* bias = _bias;

    // permute
    Mat tmp;
    if (size >= 8)
        tmp.create(8 * maxk, inch, size / 8 + (size % 8) / 4 + size % 4, 64u, 16, opt.workspace_allocator);
    else if (size >= 4)
        tmp.create(4 * maxk, inch, size / 4 + size % 4, 64u, 16, opt.workspace_allocator);
    else
        tmp.create(maxk, inch, size, 64u, 16, opt.workspace_allocator);
    {
        int nn_size = size / 8;
        int remain_size_start = 0;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 8;

            float* tmpptr = tmp.channel(i / 8);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i * 16;

                for (int k = 0; k < maxk; k++)
                {
                    // transpose 16x8
                    __m512 _r0 = _mm512_loadu_ps(img0);
                    __m512 _r1 = _mm512_loadu_ps(img0 + 16);
                    __m512 _r2 = _mm512_loadu_ps(img0 + 16 * 2);
                    __m512 _r3 = _mm512_loadu_ps(img0 + 16 * 3);
                    __m512 _r4 = _mm512_loadu_ps(img0 + 16 * 4);
                    __m512 _r5 = _mm512_loadu_ps(img0 + 16 * 5);
                    __m512 _r6 = _mm512_loadu_ps(img0 + 16 * 6);
                    __m512 _r7 = _mm512_loadu_ps(img0 + 16 * 7);

                    __m512 _tmp0 = _mm512_unpacklo_ps(_r0, _r1);
                    __m512 _tmp1 = _mm512_unpackhi_ps(_r0, _r1);
                    __m512 _tmp2 = _mm512_unpacklo_ps(_r2, _r3);
                    __m512 _tmp3 = _mm512_unpackhi_ps(_r2, _r3);
                    __m512 _tmp4 = _mm512_unpacklo_ps(_r4, _r5);
                    __m512 _tmp5 = _mm512_unpackhi_ps(_r4, _r5);
                    __m512 _tmp6 = _mm512_unpacklo_ps(_r6, _r7);
                    __m512 _tmp7 = _mm512_unpackhi_ps(_r6, _r7);

                    __m512 _tmp8 = _mm512_shuffle_ps(_tmp0, _tmp2, _MM_SHUFFLE(1, 0, 1, 0));
                    __m512 _tmp9 = _mm512_shuffle_ps(_tmp0, _tmp2, _MM_SHUFFLE(3, 2, 3, 2));
                    __m512 _tmpa = _mm512_shuffle_ps(_tmp1, _tmp3, _MM_SHUFFLE(1, 0, 1, 0));
                    __m512 _tmpb = _mm512_shuffle_ps(_tmp1, _tmp3, _MM_SHUFFLE(3, 2, 3, 2));
                    __m512 _tmpc = _mm512_shuffle_ps(_tmp4, _tmp6, _MM_SHUFFLE(1, 0, 1, 0));
                    __m512 _tmpd = _mm512_shuffle_ps(_tmp4, _tmp6, _MM_SHUFFLE(3, 2, 3, 2));
                    __m512 _tmpe = _mm512_shuffle_ps(_tmp5, _tmp7, _MM_SHUFFLE(1, 0, 1, 0));
                    __m512 _tmpf = _mm512_shuffle_ps(_tmp5, _tmp7, _MM_SHUFFLE(3, 2, 3, 2));

                    _tmp0 = _mm512_shuffle_f32x4(_tmp8, _tmpc, _MM_SHUFFLE(2, 0, 2, 0));
                    _tmp1 = _mm512_shuffle_f32x4(_tmp9, _tmpd, _MM_SHUFFLE(2, 0, 2, 0));
                    _tmp2 = _mm512_shuffle_f32x4(_tmpa, _tmpe, _MM_SHUFFLE(2, 0, 2, 0));
                    _tmp3 = _mm512_shuffle_f32x4(_tmpb, _tmpf, _MM_SHUFFLE(2, 0, 2, 0));
                    _tmp4 = _mm512_shuffle_f32x4(_tmp8, _tmpc, _MM_SHUFFLE(3, 1, 3, 1));
                    _tmp5 = _mm512_shuffle_f32x4(_tmp9, _tmpd, _MM_SHUFFLE(3, 1, 3, 1));
                    _tmp6 = _mm512_shuffle_f32x4(_tmpa, _tmpe, _MM_SHUFFLE(3, 1, 3, 1));
                    _tmp7 = _mm512_shuffle_f32x4(_tmpb, _tmpf, _MM_SHUFFLE(3, 1, 3, 1));

                    _r0 = _mm512_shuffle_f32x4(_tmp0, _tmp1, _MM_SHUFFLE(2, 0, 2, 0));
                    _r1 = _mm512_shuffle_f32x4(_tmp2, _tmp3, _MM_SHUFFLE(2, 0, 2, 0));
                    _r2 = _mm512_shuffle_f32x4(_tmp4, _tmp5, _MM_SHUFFLE(2, 0, 2, 0));
                    _r3 = _mm512_shuffle_f32x4(_tmp6, _tmp7, _MM_SHUFFLE(2, 0, 2, 0));
                    _r4 = _mm512_shuffle_f32x4(_tmp0, _tmp1, _MM_SHUFFLE(3, 1, 3, 1));
                    _r5 = _mm512_shuffle_f32x4(_tmp2, _tmp3, _MM_SHUFFLE(3, 1, 3, 1));
                    _r6 = _mm512_shuffle_f32x4(_tmp4, _tmp5, _MM_SHUFFLE(3, 1, 3, 1));
                    _r7 = _mm512_shuffle_f32x4(_tmp6, _tmp7, _MM_SHUFFLE(3, 1, 3, 1));

                    _mm512_storeu_ps(tmpptr, _r0);
                    _mm512_storeu_ps(tmpptr + 16, _r1);
                    _mm512_storeu_ps(tmpptr + 16 * 2, _r2);
                    _mm512_storeu_ps(tmpptr + 16 * 3, _r3);
                    _mm512_storeu_ps(tmpptr + 16 * 4, _r4);
                    _mm512_storeu_ps(tmpptr + 16 * 5, _r5);
                    _mm512_storeu_ps(tmpptr + 16 * 6, _r6);
                    _mm512_storeu_ps(tmpptr + 16 * 7, _r7);

                    img0 += size * 16;
                    tmpptr += 128;
                }
            }
        }

        remain_size_start += nn_size << 3;
        nn_size = (size - remain_size_start) >> 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 4;

            float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i * 16;

                for (int k = 0; k < maxk; k++)
                {
                    // transpose 16x4
                    __m512 _r0 = _mm512_loadu_ps(img0);
                    __m512 _r1 = _mm512_loadu_ps(img0 + 16);
                    __m512 _r2 = _mm512_loadu_ps(img0 + 16 * 2);
                    __m512 _r3 = _mm512_loadu_ps(img0 + 16 * 3);

                    __m512 _tmp0 = _mm512_unpacklo_ps(_r0, _r1);
                    __m512 _tmp1 = _mm512_unpackhi_ps(_r0, _r1);
                    __m512 _tmp2 = _mm512_unpacklo_ps(_r2, _r3);
                    __m512 _tmp3 = _mm512_unpackhi_ps(_r2, _r3);

                    __m512 _tmp4 = _mm512_shuffle_ps(_tmp0, _tmp2, _MM_SHUFFLE(1, 0, 1, 0));
                    __m512 _tmp5 = _mm512_shuffle_ps(_tmp0, _tmp2, _MM_SHUFFLE(3, 2, 3, 2));
                    __m512 _tmp6 = _mm512_shuffle_ps(_tmp1, _tmp3, _MM_SHUFFLE(1, 0, 1, 0));
                    __m512 _tmp7 = _mm512_shuffle_ps(_tmp1, _tmp3, _MM_SHUFFLE(3, 2, 3, 2));

                    _tmp0 = _mm512_shuffle_f32x4(_tmp4, _tmp5, _MM_SHUFFLE(2, 0, 2, 0));
                    _tmp1 = _mm512_shuffle_f32x4(_tmp6, _tmp7, _MM_SHUFFLE(2, 0, 2, 0));
                    _tmp2 = _mm512_shuffle_f32x4(_tmp4, _tmp5, _MM_SHUFFLE(3, 1, 3, 1));
                    _tmp3 = _mm512_shuffle_f32x4(_tmp6, _tmp7, _MM_SHUFFLE(3, 1, 3, 1));

                    _r0 = _mm512_shuffle_f32x4(_tmp0, _tmp1, _MM_SHUFFLE(2, 0, 2, 0));
                    _r1 = _mm512_shuffle_f32x4(_tmp2, _tmp3, _MM_SHUFFLE(2, 0, 2, 0));
                    _r2 = _mm512_shuffle_f32x4(_tmp0, _tmp1, _MM_SHUFFLE(3, 1, 3, 1));
                    _r3 = _mm512_shuffle_f32x4(_tmp2, _tmp3, _MM_SHUFFLE(3, 1, 3, 1));

                    _mm512_storeu_ps(tmpptr, _r0);
                    _mm512_storeu_ps(tmpptr + 16, _r1);
                    _mm512_storeu_ps(tmpptr + 16 * 2, _r2);
                    _mm512_storeu_ps(tmpptr + 16 * 3, _r3);

                    img0 += size * 16;
                    tmpptr += 64;
                }
            }
        }

        remain_size_start += nn_size << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < size; i++)
        {
            float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4 + i % 4);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i * 16;

                for (int k = 0; k < maxk; k++)
                {
                    __m512 _val = _mm512_load_ps(img0);
                    _mm512_store_ps(tmpptr, _val);

                    img0 += size * 16;
                    tmpptr += 16;
                }
            }
        }
    }

    int nn_outch = 0;
    int remain_outch_start = 0;

    nn_outch = outch >> 1;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int pp = 0; pp < nn_outch; pp++)
    {
        int p = pp * 2;

        float* outptr0 = top_blob.channel(p);
        float* outptr1 = top_blob.channel(p + 1);

        const float zeros[16] = {0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f};
        const float* biasptr = bias ? bias + p * 8 : zeros;

        int i = 0;
        for (; i + 7 < size; i += 8)
        {
            float* tmpptr = tmp.channel(i / 8);
            const float* kptr = kernel.channel(p / 2);

            int nn = inch * maxk * 16; // inch always > 0

            __m512 _sum0 = _mm512_loadu_ps(biasptr);
            __m512 _sum1 = _sum0;
            __m512 _sum2 = _sum0;
            __m512 _sum3 = _sum0;
            __m512 _sum4 = _sum0;
            __m512 _sum5 = _sum0;
            __m512 _sum6 = _sum0;
            __m512 _sum7 = _sum0;

            for (int j = 0; j < nn; j++)
            {
                __m512 _w0 = _mm512_load_ps(kptr);

                __m512 _val0 = _mm512_set1_ps(tmpptr[0]);
                __m512 _val1 = _mm512_set1_ps(tmpptr[1]);
                __m512 _val2 = _mm512_set1_ps(tmpptr[2]);
                __m512 _val3 = _mm512_set1_ps(tmpptr[3]);
                __m512 _val4 = _mm512_set1_ps(tmpptr[4]);
                __m512 _val5 = _mm512_set1_ps(tmpptr[5]);
                __m512 _val6 = _mm512_set1_ps(tmpptr[6]);
                __m512 _val7 = _mm512_set1_ps(tmpptr[7]);
                _sum0 = _mm512_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm512_fmadd_ps(_val1, _w0, _sum1);
                _sum2 = _mm512_fmadd_ps(_val2, _w0, _sum2);
                _sum3 = _mm512_fmadd_ps(_val3, _w0, _sum3);
                _sum4 = _mm512_fmadd_ps(_val4, _w0, _sum4);
                _sum5 = _mm512_fmadd_ps(_val5, _w0, _sum5);
                _sum6 = _mm512_fmadd_ps(_val6, _w0, _sum6);
                _sum7 = _mm512_fmadd_ps(_val7, _w0, _sum7);

                tmpptr += 8;
                kptr += 16;
            }

            _mm256_store_ps(outptr0, _mm512_extractf32x8_ps(_sum0, 0));
            _mm256_store_ps(outptr0 + 8, _mm512_extractf32x8_ps(_sum1, 0));
            _mm256_store_ps(outptr0 + 8 * 2, _mm512_extractf32x8_ps(_sum2, 0));
            _mm256_store_ps(outptr0 + 8 * 3, _mm512_extractf32x8_ps(_sum3, 0));
            _mm256_store_ps(outptr0 + 8 * 4, _mm512_extractf32x8_ps(_sum4, 0));
            _mm256_store_ps(outptr0 + 8 * 5, _mm512_extractf32x8_ps(_sum5, 0));
            _mm256_store_ps(outptr0 + 8 * 6, _mm512_extractf32x8_ps(_sum6, 0));
            _mm256_store_ps(outptr0 + 8 * 7, _mm512_extractf32x8_ps(_sum7, 0));
            _mm256_store_ps(outptr1, _mm512_extractf32x8_ps(_sum0, 1));
            _mm256_store_ps(outptr1 + 8, _mm512_extractf32x8_ps(_sum1, 1));
            _mm256_store_ps(outptr1 + 8 * 2, _mm512_extractf32x8_ps(_sum2, 1));
            _mm256_store_ps(outptr1 + 8 * 3, _mm512_extractf32x8_ps(_sum3, 1));
            _mm256_store_ps(outptr1 + 8 * 4, _mm512_extractf32x8_ps(_sum4, 1));
            _mm256_store_ps(outptr1 + 8 * 5, _mm512_extractf32x8_ps(_sum5, 1));
            _mm256_store_ps(outptr1 + 8 * 6, _mm512_extractf32x8_ps(_sum6, 1));
            _mm256_store_ps(outptr1 + 8 * 7, _mm512_extractf32x8_ps(_sum7, 1));

            outptr0 += 64;
            outptr1 += 64;
        }
        for (; i + 3 < size; i += 4)
        {
            float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4);
            const float* kptr = kernel.channel(p / 2);

            int nn = inch * maxk * 16; // inch always > 0

            __m512 _sum0 = _mm512_loadu_ps(biasptr);
            __m512 _sum1 = _sum0;
            __m512 _sum2 = _sum0;
            __m512 _sum3 = _sum0;

            for (int j = 0; j < nn; j++)
            {
                __m512 _w0 = _mm512_load_ps(kptr);

                __m512 _val0 = _mm512_set1_ps(tmpptr[0]);
                __m512 _val1 = _mm512_set1_ps(tmpptr[1]);
                __m512 _val2 = _mm512_set1_ps(tmpptr[2]);
                __m512 _val3 = _mm512_set1_ps(tmpptr[3]);
                _sum0 = _mm512_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm512_fmadd_ps(_val1, _w0, _sum1);
                _sum2 = _mm512_fmadd_ps(_val2, _w0, _sum2);
                _sum3 = _mm512_fmadd_ps(_val3, _w0, _sum3);

                tmpptr += 4;
                kptr += 16;
            }

            _mm256_store_ps(outptr0, _mm512_extractf32x8_ps(_sum0, 0));
            _mm256_store_ps(outptr0 + 8, _mm512_extractf32x8_ps(_sum1, 0));
            _mm256_store_ps(outptr0 + 16, _mm512_extractf32x8_ps(_sum2, 0));
            _mm256_store_ps(outptr0 + 24, _mm512_extractf32x8_ps(_sum3, 0));
            _mm256_store_ps(outptr1, _mm512_extractf32x8_ps(_sum0, 1));
            _mm256_store_ps(outptr1 + 8, _mm512_extractf32x8_ps(_sum1, 1));
            _mm256_store_ps(outptr1 + 16, _mm512_extractf32x8_ps(_sum2, 1));
            _mm256_store_ps(outptr1 + 24, _mm512_extractf32x8_ps(_sum3, 1));

            outptr0 += 32;
            outptr1 += 32;
        }
        for (; i < size; i++)
        {
            float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4 + i % 4);
            const float* kptr = kernel.channel(p / 2);

            int nn = inch * maxk * 16; // inch always > 0

            __m512 _sum = _mm512_loadu_ps(biasptr);

            for (int j = 0; j < nn; j++)
            {
                __m512 _w0 = _mm512_load_ps(kptr);
                __m512 _val0 = _mm512_set1_ps(tmpptr[0]);
                _sum = _mm512_fmadd_ps(_val0, _w0, _sum);

                tmpptr += 1;
                kptr += 16;
            }

            _mm256_store_ps(outptr0, _mm512_extractf32x8_ps(_sum, 0));
            _mm256_store_ps(outptr1, _mm512_extractf32x8_ps(_sum, 1));

            outptr0 += 8;
            outptr1 += 8;
        }
    }

    remain_outch_start += nn_outch << 1;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = remain_outch_start; p < outch; p++)
    {
        float* outptr0 = top_blob.channel(p);

        const float zeros[8] = {0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f};
        const float* biasptr = bias ? bias + p * 8 : zeros;

        int i = 0;
        for (; i + 7 < size; i += 8)
        {
            float* tmpptr = tmp.channel(i / 8);
            const float* kptr = kernel.channel(p / 2 + p % 2);

            int nn = inch * maxk * 16; // inch always > 0

            __m256 _sum0 = _mm256_loadu_ps(biasptr);
            __m256 _sum1 = _sum0;
            __m256 _sum2 = _sum0;
            __m256 _sum3 = _sum0;
            __m256 _sum4 = _sum0;
            __m256 _sum5 = _sum0;
            __m256 _sum6 = _sum0;
            __m256 _sum7 = _sum0;

            for (int j = 0; j < nn; j++)
            {
                __m256 _w0 = _mm256_load_ps(kptr);

                __m256 _val0 = _mm256_broadcast_ss(tmpptr);
                __m256 _val1 = _mm256_broadcast_ss(tmpptr + 1);
                __m256 _val2 = _mm256_broadcast_ss(tmpptr + 2);
                __m256 _val3 = _mm256_broadcast_ss(tmpptr + 3);
                __m256 _val4 = _mm256_broadcast_ss(tmpptr + 4);
                __m256 _val5 = _mm256_broadcast_ss(tmpptr + 5);
                __m256 _val6 = _mm256_broadcast_ss(tmpptr + 6);
                __m256 _val7 = _mm256_broadcast_ss(tmpptr + 7);
                _sum0 = _mm256_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm256_fmadd_ps(_val1, _w0, _sum1);
                _sum2 = _mm256_fmadd_ps(_val2, _w0, _sum2);
                _sum3 = _mm256_fmadd_ps(_val3, _w0, _sum3);
                _sum4 = _mm256_fmadd_ps(_val4, _w0, _sum4);
                _sum5 = _mm256_fmadd_ps(_val5, _w0, _sum5);
                _sum6 = _mm256_fmadd_ps(_val6, _w0, _sum6);
                _sum7 = _mm256_fmadd_ps(_val7, _w0, _sum7);

                tmpptr += 8;
                kptr += 8;
            }

            _mm256_store_ps(outptr0, _sum0);
            _mm256_store_ps(outptr0 + 8, _sum1);
            _mm256_store_ps(outptr0 + 8 * 2, _sum2);
            _mm256_store_ps(outptr0 + 8 * 3, _sum3);
            _mm256_store_ps(outptr0 + 8 * 4, _sum4);
            _mm256_store_ps(outptr0 + 8 * 5, _sum5);
            _mm256_store_ps(outptr0 + 8 * 6, _sum6);
            _mm256_store_ps(outptr0 + 8 * 7, _sum7);

            outptr0 += 64;
        }
        for (; i + 3 < size; i += 4)
        {
            float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4);
            const float* kptr = kernel.channel(p / 2 + p % 2);

            int nn = inch * maxk * 16; // inch always > 0

            __m256 _sum0 = _mm256_loadu_ps(biasptr);
            __m256 _sum1 = _sum0;
            __m256 _sum2 = _sum0;
            __m256 _sum3 = _sum0;

            for (int j = 0; j < nn; j++)
            {
                __m256 _w0 = _mm256_load_ps(kptr);

                __m256 _val0 = _mm256_broadcast_ss(tmpptr);
                __m256 _val1 = _mm256_broadcast_ss(tmpptr + 1);
                __m256 _val2 = _mm256_broadcast_ss(tmpptr + 2);
                __m256 _val3 = _mm256_broadcast_ss(tmpptr + 3);
                _sum0 = _mm256_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm256_fmadd_ps(_val1, _w0, _sum1);
                _sum2 = _mm256_fmadd_ps(_val2, _w0, _sum2);
                _sum3 = _mm256_fmadd_ps(_val3, _w0, _sum3);

                tmpptr += 4;
                kptr += 8;
            }

            _mm256_store_ps(outptr0, _sum0);
            _mm256_store_ps(outptr0 + 8, _sum1);
            _mm256_store_ps(outptr0 + 16, _sum2);
            _mm256_store_ps(outptr0 + 24, _sum3);

            outptr0 += 32;
        }
        for (; i < size; i++)
        {
            float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4 + i % 4);
            const float* kptr = kernel.channel(p / 2 + p % 2);

            int nn = inch * maxk * 16; // inch always > 0

            __m256 _sum = _mm256_loadu_ps(biasptr);

            for (int j = 0; j < nn; j++)
            {
                __m256 _w0 = _mm256_load_ps(kptr);
                __m256 _val0 = _mm256_broadcast_ss(tmpptr);
                _sum = _mm256_fmadd_ps(_val0, _w0, _sum);

                tmpptr += 1;
                kptr += 8;
            }

            _mm256_store_ps(outptr0, _sum);

            outptr0 += 8;
        }
    }
}